

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_blockhash.cpp
# Opt level: O0

void __thiscall BlockHash_Constractor_hex_Test::TestBody(BlockHash_Constractor_hex_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1b8;
  Message local_1b0;
  ByteData local_1a8;
  string local_190;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_2;
  Message local_158;
  int local_14c;
  ByteData local_148;
  size_t local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  Message local_110;
  string local_108;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  string local_d0;
  undefined1 local_b0 [8];
  BlockHash blockhash;
  Message local_88 [2];
  CfdException *anon_var_0;
  string local_70;
  undefined1 local_50 [8];
  BlockHash blockhash_1;
  char *pcStack_18;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  BlockHash_Constractor_hex_Test *this_local;
  
  gtest_msg.value = (char *)this;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffe8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffe8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_70,"",(allocator *)((long)&anon_var_0 + 7));
      cfd::core::BlockHash::BlockHash((BlockHash *)local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      cfd::core::BlockHash::~BlockHash((BlockHash *)local_50);
    }
    pcStack_18 = 
    "Expected: BlockHash blockhash(\"\") throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_88);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)
             &blockhash.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_blockhash.cpp"
             ,0x11,pcStack_18);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)
             &blockhash.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_88);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)
             &blockhash.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  testing::Message::~Message(local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,"3412907856341290785634129078563412907856341290785634129078563412",
             (allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  cfd::core::BlockHash::BlockHash((BlockHash *)local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  cfd::core::BlockHash::GetHex_abi_cxx11_(&local_108,(BlockHash *)local_b0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_e8,"blockhash.GetHex().c_str()",
             "\"3412907856341290785634129078563412907856341290785634129078563412\"",pcVar2,
             "3412907856341290785634129078563412907856341290785634129078563412");
  std::__cxx11::string::~string((string *)&local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_blockhash.cpp"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  cfd::core::BlockHash::GetData(&local_148,(BlockHash *)local_b0);
  local_130 = cfd::core::ByteData::GetDataSize(&local_148);
  local_14c = 0x20;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_128,"blockhash.GetData().GetDataSize()","32",&local_130,
             &local_14c);
  cfd::core::ByteData::~ByteData(&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_blockhash.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  cfd::core::BlockHash::GetData(&local_1a8,(BlockHash *)local_b0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_190,&local_1a8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_170,"blockhash.GetData().GetHex().c_str()",
             "\"1234567890123456789012345678901234567890123456789012345678901234\"",pcVar2,
             "1234567890123456789012345678901234567890123456789012345678901234");
  std::__cxx11::string::~string((string *)&local_190);
  cfd::core::ByteData::~ByteData(&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_blockhash.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  cfd::core::BlockHash::~BlockHash((BlockHash *)local_b0);
  return;
}

Assistant:

TEST(BlockHash, Constractor_hex) {
  // empty
  EXPECT_THROW(BlockHash blockhash(""), CfdException);

  BlockHash blockhash(
      "3412907856341290785634129078563412907856341290785634129078563412");
  EXPECT_STREQ(
      blockhash.GetHex().c_str(),
      "3412907856341290785634129078563412907856341290785634129078563412");
  EXPECT_EQ(blockhash.GetData().GetDataSize(), 32);
  EXPECT_STREQ(
      blockhash.GetData().GetHex().c_str(),
      "1234567890123456789012345678901234567890123456789012345678901234");
}